

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpUpdate_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 *puVar4;
  double *pdVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  piVar3 = (int *)I->content;
  iVar1 = piVar3[6];
  iVar2 = *piVar3;
  puVar4 = *(undefined8 **)(piVar3 + 2);
  pdVar5 = *(double **)(piVar3 + 4);
  dVar9 = (ABS(ark_mem->h) + ABS(ark_mem->tcur)) * ark_mem->uround * 100.0;
  *(double *)(piVar3 + 8) = dVar9;
  dVar10 = ABS(tnew - *pdVar5);
  if (1 < (long)iVar1) {
    lVar8 = 1;
    do {
      if (ABS(tnew - pdVar5[lVar8]) <= dVar10) {
        dVar10 = ABS(tnew - pdVar5[lVar8]);
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  if (dVar9 < dVar10) {
    uVar6 = puVar4[(long)iVar2 + -1];
    if (1 < iVar2) {
      lVar8 = ((long)iVar2 - 1U & 0xffffffff) + 1;
      do {
        pdVar5[lVar8 + -1] = pdVar5[lVar8 + -2];
        puVar4[lVar8 + -1] = puVar4[lVar8 + -2];
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    *puVar4 = uVar6;
    *pdVar5 = tnew;
    N_VScale(0x3ff0000000000000,ark_mem->ycur);
    iVar7 = iVar1 + 1;
    if (iVar2 <= iVar1 + 1) {
      iVar7 = iVar2;
    }
    *(int *)((long)I->content + 0x18) = iVar7;
  }
  return 0;
}

Assistant:

int arkInterpUpdate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;
  sunrealtype tdiff;
  N_Vector ytmp;
  int nhist, nmax;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  nmax  = LINT_NMAX(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* update t roundoff value */
  LINT_TROUND(I) = FUZZ_FACTOR * ark_mem->uround *
                   (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* determine if tnew differs sufficiently from stored values */
  tdiff = SUNRabs(tnew - thist[0]);
  for (i = 1; i < nhist; i++)
  {
    tdiff = SUNMIN(tdiff, SUNRabs(tnew - thist[i]));
  }
  if (tdiff <= LINT_TROUND(I)) { return (ARK_SUCCESS); }

  /* shift (t,y) history arrays by one */
  ytmp = yhist[nmax - 1];
  for (i = nmax - 1; i > 0; i--)
  {
    thist[i] = thist[i - 1];
    yhist[i] = yhist[i - 1];
  }
  yhist[0] = ytmp;

  /* copy tnew and ycur into first entry of history arrays */
  thist[0] = tnew;
  N_VScale(ONE, ark_mem->ycur, yhist[0]);

  /* update 'nhist' (first few steps) */
  LINT_NHIST(I) = nhist = SUNMIN(nhist + 1, nmax);

  /* return with success */
  return (ARK_SUCCESS);
}